

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

qsizetype __thiscall QUnifiedTimer::runningAnimationCount(QUnifiedTimer *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  qsizetype qVar4;
  long lVar5;
  
  lVar1 = *(long *)(this + 0x80);
  if (lVar1 == 0) {
    qVar4 = 0;
  }
  else {
    lVar2 = *(long *)(this + 0x78);
    lVar5 = 0;
    qVar4 = 0;
    do {
      lVar3 = (**(code **)(**(long **)(lVar2 + lVar5) + 0x70))();
      qVar4 = qVar4 + lVar3;
      lVar5 = lVar5 + 8;
    } while (lVar1 << 3 != lVar5);
  }
  return qVar4;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }